

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

void __thiscall cxxopts::OptionDetails::OptionDetails(OptionDetails *this,OptionDetails *rhs)

{
  pointer pcVar1;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  (this->m_short)._M_dataplus._M_p = (pointer)&(this->m_short).field_2;
  (this->m_short)._M_string_length = 0;
  (this->m_short).field_2._M_local_buf[0] = '\0';
  (this->m_long)._M_dataplus._M_p = (pointer)&(this->m_long).field_2;
  (this->m_long)._M_string_length = 0;
  (this->m_long).field_2._M_local_buf[0] = '\0';
  (this->m_desc)._M_dataplus._M_p = (pointer)&(this->m_desc).field_2;
  pcVar1 = (rhs->m_desc)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_desc,pcVar1,pcVar1 + (rhs->m_desc)._M_string_length);
  (*((rhs->m_value).super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Value[2])(&local_48);
  (this->m_value).super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_48;
  (this->m_value).super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Stack_40;
  this->m_count = rhs->m_count;
  this->m_hash = 0;
  return;
}

Assistant:

OptionDetails(const OptionDetails& rhs)
    : m_desc(rhs.m_desc)
    , m_value(rhs.m_value->clone())
    , m_count(rhs.m_count)
    {
    }